

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_DeletionMarkers2::_Run(_Test_DeletionMarkers2 *this)

{
  allocator local_209;
  undefined1 local_208 [32];
  Slice local_1e8;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  Tester local_1b0;
  
  std::__cxx11::string::string((string *)&local_1b0,"foo",(allocator *)(local_208 + 0x20));
  std::__cxx11::string::string((string *)local_208,"v1",&local_209);
  DBTest::Put((DBTest *)(local_1c8 + 8),(string *)this,(string *)&local_1b0);
  Status::~Status((Status *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x56a);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_208);
  test::Tester::IsOk(&local_1b0,(Status *)local_208);
  Status::~Status((Status *)local_208);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x56c);
  local_208._0_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,2);
  local_1e8.data_._0_4_ = 1;
  test::Tester::IsEq<int,int>(&local_1b0,(int *)local_208,(int *)(local_208 + 0x20));
  test::Tester::~Tester(&local_1b0);
  std::__cxx11::string::string((string *)&local_1b0,"a",(allocator *)(local_208 + 0x20));
  std::__cxx11::string::string((string *)local_208,"begin",&local_209);
  DBTest::Put((DBTest *)local_1c8,(string *)this,(string *)&local_1b0);
  Status::~Status((Status *)local_1c8);
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string((string *)&local_1b0,"z",(allocator *)(local_208 + 0x20));
  std::__cxx11::string::string((string *)local_208,"end",&local_209);
  DBTest::Put((DBTest *)(local_1d8 + 8),(string *)this,(string *)&local_1b0);
  Status::~Status((Status *)(local_1d8 + 8));
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)&local_1b0);
  DBImpl::TEST_CompactMemTable((DBImpl *)(local_1c8 + 0x10));
  Status::~Status((Status *)(local_1c8 + 0x10));
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x572);
  local_208._0_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,2);
  local_1e8.data_._0_4_ = 1;
  test::Tester::IsEq<int,int>(&local_1b0,(int *)local_208,(int *)(local_208 + 0x20));
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x573);
  local_208._0_4_ = DBTest::NumTableFilesAtLevel(&this->super_DBTest,1);
  local_1e8.data_ = (char *)CONCAT44(local_1e8.data_._4_4_,1);
  test::Tester::IsEq<int,int>(&local_1b0,(int *)local_208,(int *)(local_208 + 0x20));
  test::Tester::~Tester(&local_1b0);
  std::__cxx11::string::string((string *)&local_1b0,"foo",(allocator *)local_208);
  DBTest::Delete((DBTest *)(local_208 + 0x30),(string *)this);
  Status::~Status((Status *)(local_208 + 0x30));
  std::__cxx11::string::~string((string *)&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x576);
  local_1e8.data_ = "foo";
  local_1e8.size_ = 3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_208,&this->super_DBTest,(Slice *)(local_208 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            (&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
             (char (*) [12])"[ DEL, v1 ]");
  std::__cxx11::string::~string((string *)local_208);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x577);
  DBImpl::TEST_CompactMemTable((DBImpl *)local_208);
  test::Tester::IsOk(&local_1b0,(Status *)local_208);
  Status::~Status((Status *)local_208);
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x578);
  local_1e8.data_ = "foo";
  local_1e8.size_ = 3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_208,&this->super_DBTest,(Slice *)(local_208 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            (&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
             (char (*) [12])"[ DEL, v1 ]");
  std::__cxx11::string::~string((string *)local_208);
  test::Tester::~Tester(&local_1b0);
  DBImpl::TEST_CompactRange((DBImpl *)(this->super_DBTest).db_,0,(Slice *)0x0,(Slice *)0x0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x57b);
  local_1e8.data_ = "foo";
  local_1e8.size_ = 3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_208,&this->super_DBTest,(Slice *)(local_208 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[12]>
            (&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
             (char (*) [12])"[ DEL, v1 ]");
  std::__cxx11::string::~string((string *)local_208);
  test::Tester::~Tester(&local_1b0);
  DBImpl::TEST_CompactRange((DBImpl *)(this->super_DBTest).db_,1,(Slice *)0x0,(Slice *)0x0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x57f);
  local_1e8.data_ = "foo";
  local_1e8.size_ = 3;
  DBTest::AllEntriesFor_abi_cxx11_
            ((string *)local_208,&this->super_DBTest,(Slice *)(local_208 + 0x20));
  test::Tester::IsEq<std::__cxx11::string,char[4]>
            (&local_1b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
             (char (*) [4])"[ ]");
  std::__cxx11::string::~string((string *)local_208);
  test::Tester::~Tester(&local_1b0);
  return;
}

Assistant:

TEST(DBTest, DeletionMarkers2) {
  Put("foo", "v1");
  ASSERT_OK(dbfull()->TEST_CompactMemTable());
  const int last = config::kMaxMemCompactLevel;
  ASSERT_EQ(NumTableFilesAtLevel(last), 1);  // foo => v1 is now in last level

  // Place a table at level last-1 to prevent merging with preceding mutation
  Put("a", "begin");
  Put("z", "end");
  dbfull()->TEST_CompactMemTable();
  ASSERT_EQ(NumTableFilesAtLevel(last), 1);
  ASSERT_EQ(NumTableFilesAtLevel(last - 1), 1);

  Delete("foo");
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  ASSERT_OK(dbfull()->TEST_CompactMemTable());  // Moves to level last-2
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  dbfull()->TEST_CompactRange(last - 2, nullptr, nullptr);
  // DEL kept: "last" file overlaps
  ASSERT_EQ(AllEntriesFor("foo"), "[ DEL, v1 ]");
  dbfull()->TEST_CompactRange(last - 1, nullptr, nullptr);
  // Merging last-1 w/ last, so we are the base level for "foo", so
  // DEL is removed.  (as is v1).
  ASSERT_EQ(AllEntriesFor("foo"), "[ ]");
}